

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.h
# Opt level: O0

Variant __thiscall QUuid::variant(void *param_1)

{
  byte bVar1;
  bool bVar2;
  quint8 var;
  undefined4 local_4;
  
  bVar1 = *(byte *)((long)param_1 + 8) & 0xe0;
  if (bVar1 < 0x80) {
    bVar2 = isNull((QUuid *)param_1);
    local_4 = NCS;
    if (bVar2) {
      local_4 = VarUnknown;
    }
  }
  else if (bVar1 < 0xc0) {
    local_4 = DCE;
  }
  else {
    local_4 = (int)(uint)bVar1 >> 5;
  }
  return local_4;
}

Assistant:

constexpr Variant variant(QT6_DECL_NEW_OVERLOAD) const noexcept
    {
        // Check the 3 MSB of data4[0]
        const quint8 var = data4[0] & 0xE0;
        if (var < 0x80)
            return isNull(QT6_CALL_NEW_OVERLOAD) ? VarUnknown : NCS;
        if (var < 0xC0)
            return DCE;
        return Variant(var >> 5); // Microsoft or Reserved
    }